

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  lest lVar1;
  expected<Explicit,_char> *in_RDX;
  ForStreamable<nonstd::expected_lite::expected<Explicit,_char>,_std::string> FStack_38;
  
  lVar1 = (*(lest **)this)[4];
  make_string<nonstd::expected_lite::expected<Explicit,char>>(&FStack_38,*(lest **)this,in_RDX);
  __return_storage_ptr__->passed = (bool)lVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,&FStack_38);
  std::__cxx11::string::~string((string *)&FStack_38);
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result{ !!lhs, to_string( lhs ) }; }